

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtSemiCanonicize(word *pTruth,int nVars,char *pCanonPerm,int *pStoreOut,int fOnlySwap)

{
  char cVar1;
  word wVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  word *pwVar17;
  ulong uVar18;
  int *pStore;
  word *pLimit;
  int pStoreIn [17];
  uint local_a8;
  int local_78 [18];
  
  pStore = local_78;
  if (pStoreOut != (int *)0x0) {
    pStore = pStoreOut;
  }
  bVar6 = (byte)nVars;
  uVar3 = 1 << (bVar6 - 6 & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x24e,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *, int)");
  }
  uVar18 = (ulong)(uint)nVars;
  if (0 < nVars) {
    uVar5 = 0;
    do {
      pCanonPerm[uVar5] = (char)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar18 != uVar5);
  }
  if (nVars < 6) {
    uVar4 = 1 << (bVar6 & 0x1f);
    uVar10 = ~(-1L << ((byte)uVar4 & 0x3f)) & *pTruth;
    uVar5 = (ulong)uVar4;
    uVar12 = uVar10;
    if ((uint)nVars < 6) {
      do {
        uVar12 = uVar12 | uVar10 << ((byte)uVar5 & 0x3f);
        uVar5 = uVar5 + uVar4;
      } while (uVar5 < 0x40);
    }
    if (*pTruth != uVar12) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  iVar8 = 0;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    iVar8 = 0;
    do {
      uVar12 = pTruth[uVar5];
      if (uVar12 != 0) {
        uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
        uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
        uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
        uVar12 = (uVar12 >> 8) + uVar12;
        lVar16 = (uVar12 >> 0x10) + uVar12;
        iVar8 = iVar8 + ((int)((ulong)lVar16 >> 0x20) + (int)lVar16 & 0xffU);
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if ((fOnlySwap == 0) &&
     (iVar8 != uVar3 * 0x20 && SBORROW4(iVar8,uVar3 * 0x20) == (int)(iVar8 + uVar3 * -0x20) < 0)) {
    if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = ~pTruth[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    iVar8 = uVar3 * 0x40 - iVar8;
    local_a8 = 1 << (bVar6 & 0x1f);
  }
  else {
    local_a8 = 0;
  }
  Abc_TtCountOnesInCofs(pTruth,nVars,pStore);
  pStore[nVars] = iVar8;
  if (0 < nVars) {
    uVar5 = 0;
    do {
      if ((fOnlySwap == 0) && (iVar15 = iVar8 - pStore[uVar5], pStore[uVar5] < iVar15)) {
        if (uVar3 == 1) {
          bVar6 = (byte)(1 << ((byte)uVar5 & 0x1f));
          *pTruth = (s_Truths6[uVar5] & *pTruth) >> (bVar6 & 0x3f) |
                    *pTruth << (bVar6 & 0x3f) & s_Truths6[uVar5];
        }
        else if (uVar5 < 6) {
          if (0 < (int)uVar3) {
            uVar12 = s_Truths6[uVar5];
            uVar10 = 0;
            do {
              bVar6 = (byte)(1 << ((byte)uVar5 & 0x1f));
              pTruth[uVar10] =
                   (pTruth[uVar10] & uVar12) >> (bVar6 & 0x3f) |
                   pTruth[uVar10] << (bVar6 & 0x3f) & uVar12;
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
          }
        }
        else if (0 < (int)uVar3) {
          bVar6 = (byte)(uVar5 - 6);
          uVar4 = 1 << (bVar6 & 0x1f);
          iVar13 = 2 << (bVar6 & 0x1f);
          uVar12 = 1;
          if (1 < (int)uVar4) {
            uVar12 = (ulong)uVar4;
          }
          pwVar17 = pTruth + (int)uVar4;
          pwVar9 = pTruth;
          do {
            if (uVar5 - 6 != 0x1f) {
              uVar10 = 0;
              do {
                wVar2 = pwVar9[uVar10];
                pwVar9[uVar10] = pwVar17[uVar10];
                pwVar17[uVar10] = wVar2;
                uVar10 = uVar10 + 1;
              } while (uVar12 != uVar10);
            }
            pwVar9 = pwVar9 + iVar13;
            pwVar17 = pwVar17 + iVar13;
          } while (pwVar9 < pTruth + (int)uVar3);
        }
        local_a8 = local_a8 | 1 << ((uint)uVar5 & 0x1f);
        pStore[uVar5] = iVar15;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar18);
  }
  if (1 < nVars) {
    uVar12 = 2;
    uVar5 = 0;
    do {
      uVar10 = uVar5 + 1;
      iVar8 = (int)uVar10;
      if (uVar5 + 2 < uVar18) {
        uVar11 = uVar10 & 0xffffffff;
        uVar14 = uVar12;
        do {
          uVar7 = uVar14 & 0xffffffff;
          if (pStore[(int)uVar11] <= pStore[uVar14]) {
            uVar7 = uVar11;
          }
          uVar14 = uVar14 + 1;
          iVar8 = (int)uVar7;
          uVar11 = uVar7;
        } while (uVar18 != uVar14);
      }
      if (pStore[iVar8] < pStore[uVar5]) {
        cVar1 = pCanonPerm[uVar5];
        pCanonPerm[uVar5] = pCanonPerm[iVar8];
        pCanonPerm[iVar8] = cVar1;
        iVar15 = pStore[uVar5];
        pStore[uVar5] = pStore[iVar8];
        pStore[iVar8] = iVar15;
        local_a8 = local_a8 ^
                   (1 << ((byte)iVar8 & 0x1f) ^ 1 << ((uint)uVar5 & 0x1f)) &
                   -((local_a8 >> ((byte)iVar8 & 0x1f) ^ local_a8 >> ((byte)uVar5 & 0x1f)) & 1);
        Abc_TtSwapVars(pTruth,nVars,(uint)uVar5,iVar8);
      }
      uVar12 = uVar12 + 1;
      uVar5 = uVar10;
    } while (uVar10 != nVars - 1);
  }
  return local_a8;
}

Assistant:

static inline unsigned Abc_TtSemiCanonicize( word * pTruth, int nVars, char * pCanonPerm, int * pStoreOut, int fOnlySwap )
{
    int fUseOld = 1;
    int fOldSwap = 0;
    int pStoreIn[17];
    int * pStore = pStoreOut ? pStoreOut : pStoreIn;
    int i, nOnes, nWords = Abc_TtWordNum( nVars );
    unsigned uCanonPhase = 0;
    assert( nVars <= 16 );
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    if ( fUseOld )
    {
        // normalize polarity    
        nOnes = Abc_TtCountOnesInTruth( pTruth, nVars );
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }
    else
    {
        nOnes = Abc_TtCountOnesInCofsQuick( pTruth, nVars, pStore );
        // normalize polarity    
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            for ( i = 0; i < nVars; i++ )
                pStore[i] = nWords * 32 - pStore[i]; 
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }

    // normalize permutation
    if ( fOldSwap )
    {
        int fChange;
        do {
            fChange = 0;
            for ( i = 0; i < nVars-1; i++ )
            {
                if ( pStore[i] <= pStore[i+1] )
    //            if ( pStore[i] >= pStore[i+1] )
                    continue;
                ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
                ABC_SWAP( int, pStore[i], pStore[i+1] );
                if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> (i+1)) & 1) )
                {
                    uCanonPhase ^= (1 << i);
                    uCanonPhase ^= (1 << (i+1));
                }
                Abc_TtSwapAdjacent( pTruth, nWords, i );            
                fChange = 1;
    //            nSwaps++;
            }
        } 
        while ( fChange );
    }
    else
    {
        int k, BestK;
        for ( i = 0; i < nVars - 1; i++ )
        {
            BestK = i + 1;
            for ( k = i + 2; k < nVars; k++ )
                if ( pStore[BestK] > pStore[k] )
    //            if ( pStore[BestK] < pStore[k] )
                    BestK = k;
            if ( pStore[i] <= pStore[BestK] )
    //        if ( pStore[i] >= pStore[BestK] )
                continue;
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[BestK] );
            ABC_SWAP( int, pStore[i], pStore[BestK] );
            if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> BestK) & 1) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << BestK);
            }
            Abc_TtSwapVars( pTruth, nVars, i, BestK );
    //        nSwaps++;
        }
    }
    return uCanonPhase;
}